

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O0

bool gpt2_eval(gpt2_model *model,ggml_backend_sched_t sched,int n_past,
              vector<int,_std::allocator<int>_> *embd_inp,
              vector<float,_std::allocator<float>_> *embd_w)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  ggml_cgraph *pgVar4;
  undefined8 uVar5;
  float *pfVar6;
  vector<int,_std::allocator<int>_> *in_RCX;
  undefined8 in_RSI;
  int *in_RDI;
  ggml_tensor *inpL;
  ggml_cgraph *gf;
  int n_vocab;
  gpt2_hparams *hparams;
  int N;
  vector<int,_std::allocator<int>_> *in_stack_00000290;
  int in_stack_0000029c;
  gpt2_model *in_stack_000002a0;
  undefined4 in_stack_ffffffffffffffd0;
  
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  iVar2 = (int)sVar3;
  iVar1 = *in_RDI;
  pgVar4 = gpt2_graph(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
  ggml_backend_sched_reset(in_RSI);
  ggml_backend_sched_graph_compute(in_RSI,pgVar4);
  uVar5 = ggml_graph_node(pgVar4,0xffffffff);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
             (size_type)in_RDI);
  pfVar6 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x116256);
  ggml_backend_tensor_get(uVar5,pfVar6,(long)(iVar1 * (iVar2 + -1)) << 2,(long)iVar1 << 2);
  return true;
}

Assistant:

bool gpt2_eval(
        const gpt2_model & model,
        ggml_backend_sched_t sched,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp,
              std::vector<float>         & embd_w) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_vocab = hparams.n_vocab;

    struct ggml_cgraph * gf = gpt2_graph(model, n_past, embd_inp);

    // run the computation
    ggml_backend_sched_reset(sched);
    ggml_backend_sched_graph_compute(sched, gf);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    // in this case, the output tensor is the last one in the graph
    struct ggml_tensor * inpL = ggml_graph_node(gf, -1);

    //embd_w.resize(n_vocab*N);
    //ggml_backend_tensor_get(inpL, embd_w.data(), 0, sizeof(float)*n_vocab*N);

    // return result just for the last token
    embd_w.resize(n_vocab);
    ggml_backend_tensor_get(inpL, embd_w.data(), (n_vocab*(N-1))*sizeof(float), sizeof(float)*n_vocab);

    return true;
}